

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O2

void * CVodeCreate(int lmm,SUNContext sunctx)

{
  undefined4 uVar1;
  undefined8 *puVar2;
  char *msgfmt;
  
  if (lmm - 3U < 0xfffffffe) {
    msgfmt = "Illegal value for lmm. The legal values are CV_ADAMS and CV_BDF.";
  }
  else if (sunctx == (SUNContext)0x0) {
    msgfmt = "sunctx = NULL illegal.";
  }
  else {
    puVar2 = (undefined8 *)calloc(1,0x740);
    if (puVar2 != (undefined8 *)0x0) {
      uVar1 = 5;
      if (lmm == 1) {
        uVar1 = 0xc;
      }
      *puVar2 = sunctx;
      *(int *)(puVar2 + 4) = lmm;
      puVar2[1] = 0x3cb0000000000000;
      *(undefined4 *)(puVar2 + 8) = 1;
      puVar2[0x8e] = cvErrHandler;
      puVar2[0x8f] = puVar2;
      puVar2[0x90] = _stderr;
      *(undefined4 *)(puVar2 + 0x59) = uVar1;
      puVar2[0x5a] = 500;
      *(undefined4 *)(puVar2 + 0x5b) = 10;
      puVar2[0x61] = 0x3ff8000000000000;
      puVar2[0x62] = 0x40c3880000000000;
      puVar2[99] = 0x4024000000000000;
      puVar2[100] = 0x4024000000000000;
      puVar2[0x65] = 0x3fb999999999999a;
      puVar2[0x66] = 0x3fb999999999999a;
      puVar2[0x67] = 0x3fc999999999999a;
      puVar2[0x68] = 0x3fd0000000000000;
      puVar2[0x69] = 10;
      *(undefined4 *)(puVar2 + 0x6a) = 2;
      *(undefined8 *)((long)puVar2 + 0x2dc) = 0xa00000007;
      puVar2[0x58] = 0x3fb999999999999a;
      puVar2[0x82] = 0x14;
      puVar2[0x83] = 0x3fd3333333333333;
      *(undefined4 *)(puVar2 + 0xbd) = 1;
      *(undefined4 *)(puVar2 + 0x8b) = uVar1;
      puVar2[0x77] = 0x59;
      puVar2[0x78] = 0x28;
      return puVar2;
    }
    msgfmt = "Allocation of cvode_mem failed.";
  }
  cvProcessError((CVodeMem)0x0,0,"CVODE","CVodeCreate",msgfmt);
  return (void *)0x0;
}

Assistant:

void *CVodeCreate(int lmm, SUNContext sunctx)
{
  int maxord;
  CVodeMem cv_mem;

  /* Test inputs */

  if ((lmm != CV_ADAMS) && (lmm != CV_BDF)) {
    cvProcessError(NULL, 0, "CVODE", "CVodeCreate", MSGCV_BAD_LMM);
    return(NULL);
  }

  if (sunctx == NULL) {
    cvProcessError(NULL, 0, "CVODE", "CVodeCreate", MSGCV_NULL_SUNCTX);
    return(NULL);
  }

  cv_mem = NULL;
  cv_mem = (CVodeMem) malloc(sizeof(struct CVodeMemRec));
  if (cv_mem == NULL) {
    cvProcessError(NULL, 0, "CVODE", "CVodeCreate", MSGCV_CVMEM_FAIL);
    return(NULL);
  }

  /* Zero out cv_mem */
  memset(cv_mem, 0, sizeof(struct CVodeMemRec));

  maxord = (lmm == CV_ADAMS) ? ADAMS_Q_MAX : BDF_Q_MAX;

  /* Copy input parameters into cv_mem */
  cv_mem->cv_sunctx = sunctx;
  cv_mem->cv_lmm  = lmm;

  /* Set uround */
  cv_mem->cv_uround = UNIT_ROUNDOFF;

  /* Set default values for integrator optional inputs */
  cv_mem->cv_f                = NULL;
  cv_mem->cv_user_data        = NULL;
  cv_mem->cv_itol             = CV_NN;
  cv_mem->cv_atolmin0         = SUNTRUE;
  cv_mem->cv_user_efun        = SUNFALSE;
  cv_mem->cv_efun             = NULL;
  cv_mem->cv_e_data           = NULL;
  cv_mem->cv_ehfun            = cvErrHandler;
  cv_mem->cv_eh_data          = cv_mem;
  cv_mem->cv_monitorfun       = NULL;
  cv_mem->cv_monitor_interval = 0;
  cv_mem->cv_errfp            = stderr;
#if SUNDIALS_LOGGING_LEVEL > 0
  cv_mem->cv_errfp            = (CV_LOGGER->error_fp) ? CV_LOGGER->error_fp : stderr;
#endif
  cv_mem->cv_qmax             = maxord;
  cv_mem->cv_mxstep           = MXSTEP_DEFAULT;
  cv_mem->cv_mxhnil           = MXHNIL_DEFAULT;
  cv_mem->cv_sldeton          = SUNFALSE;
  cv_mem->cv_hin              = ZERO;
  cv_mem->cv_hmin             = HMIN_DEFAULT;
  cv_mem->cv_hmax_inv         = HMAX_INV_DEFAULT;
  cv_mem->cv_eta_min_fx       = ETA_MIN_FX_DEFAULT;
  cv_mem->cv_eta_max_fx       = ETA_MAX_FX_DEFAULT;
  cv_mem->cv_eta_max_fs       = ETA_MAX_FS_DEFAULT;
  cv_mem->cv_eta_max_es       = ETA_MAX_ES_DEFAULT;
  cv_mem->cv_eta_max_gs       = ETA_MAX_GS_DEFAULT;
  cv_mem->cv_eta_min          = ETA_MIN_DEFAULT;
  cv_mem->cv_eta_min_ef       = ETA_MIN_EF_DEFAULT;
  cv_mem->cv_eta_max_ef       = ETA_MAX_EF_DEFAULT;
  cv_mem->cv_eta_cf           = ETA_CF_DEFAULT;
  cv_mem->cv_small_nst        = SMALL_NST_DEFAULT;
  cv_mem->cv_small_nef        = SMALL_NEF_DEFAULT;
  cv_mem->cv_tstopset         = SUNFALSE;
  cv_mem->cv_maxnef           = MXNEF;
  cv_mem->cv_maxncf           = MXNCF;
  cv_mem->cv_nlscoef          = CORTES;
  cv_mem->cv_msbp             = MSBP_DEFAULT;
  cv_mem->cv_dgmax_lsetup     = DGMAX_LSETUP_DEFAULT;
  cv_mem->convfail            = CV_NO_FAILURES;
  cv_mem->cv_constraints      = NULL;
  cv_mem->cv_constraintsSet   = SUNFALSE;

  /* Initialize root finding variables */

  cv_mem->cv_glo        = NULL;
  cv_mem->cv_ghi        = NULL;
  cv_mem->cv_grout      = NULL;
  cv_mem->cv_iroots     = NULL;
  cv_mem->cv_rootdir    = NULL;
  cv_mem->cv_gfun       = NULL;
  cv_mem->cv_nrtfn      = 0;
  cv_mem->cv_gactive    = NULL;
  cv_mem->cv_mxgnull    = 1;

  /* Initialize projection variables */
  cv_mem->proj_mem     = NULL;
  cv_mem->proj_enabled = SUNFALSE;
  cv_mem->proj_applied = SUNFALSE;

  /* Set the saved value for qmax_alloc */

  cv_mem->cv_qmax_alloc = maxord;

  /* Initialize lrw and liw */

  cv_mem->cv_lrw = 58 + 2*L_MAX + NUM_TESTS;
  cv_mem->cv_liw = 40;

  /* No mallocs have been done yet */

  cv_mem->cv_VabstolMallocDone     = SUNFALSE;
  cv_mem->cv_MallocDone            = SUNFALSE;
  cv_mem->cv_constraintsMallocDone = SUNFALSE;

  /* Initialize nonlinear solver variables */
  cv_mem->NLS    = NULL;
  cv_mem->ownNLS = SUNFALSE;

  /* Initialize fused operations variable */
  cv_mem->cv_usefused = SUNFALSE;

  /* Return pointer to CVODE memory block */

  return((void *)cv_mem);
}